

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_gtar_lzma.c
# Opt level: O0

void test_read_format_gtar_lzma(void)

{
  int iVar1;
  archive *paVar2;
  char *pcVar3;
  archive *a;
  archive_entry *ae;
  int r;
  archive *in_stack_ffffffffffffffd8;
  archive *paVar4;
  archive *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  wchar_t in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  paVar2 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)paVar2 >> 0x20),(wchar_t)paVar2,
                   (char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  archive_read_support_filter_all(in_stack_ffffffffffffffd8);
  assertion_equal_int((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      in_stack_fffffffffffffff4,(longlong)paVar2,(char *)in_stack_ffffffffffffffe0,
                      (longlong)paVar2,(char *)0x17b0d0,a);
  iVar1 = archive_read_support_filter_lzma(paVar2);
  if (iVar1 == -0x14) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_lzma.c"
                   ,L'3');
    test_skipping("lzma reading not fully supported on this platform");
    archive_read_free((archive *)0x17b10e);
    assertion_equal_int((char *)CONCAT44(iVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                        (longlong)paVar2,(char *)in_stack_ffffffffffffffe0,0,(char *)0x17b13c,a);
  }
  else {
    paVar4 = paVar2;
    assertion_equal_int((char *)CONCAT44(iVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                        (longlong)paVar2,(char *)in_stack_ffffffffffffffe0,(longlong)paVar2,
                        (char *)0x17b172,a);
    archive_read_support_format_all(paVar2);
    paVar2 = paVar4;
    assertion_equal_int((char *)CONCAT44(iVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                        (longlong)paVar4,(char *)in_stack_ffffffffffffffe0,(longlong)paVar4,
                        (char *)0x17b1ab,a);
    iVar1 = archive_read_open_memory2
                      ((archive *)CONCAT44(iVar1,in_stack_fffffffffffffff8),
                       (void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                       (size_t)paVar2,(size_t)in_stack_ffffffffffffffe0);
    if (iVar1 == 0) {
      archive_read_next_header(in_stack_ffffffffffffffe0,(archive_entry **)paVar4);
      paVar4 = paVar2;
      assertion_equal_int((char *)CONCAT44(iVar1,in_stack_fffffffffffffff8),
                          in_stack_fffffffffffffff4,(longlong)paVar2,
                          (char *)in_stack_ffffffffffffffe0,(longlong)paVar2,(char *)0x17b240,a);
      archive_filter_code(in_stack_ffffffffffffffe0,(int)((ulong)paVar2 >> 0x20));
      assertion_equal_int((char *)CONCAT44(iVar1,in_stack_fffffffffffffff8),
                          in_stack_fffffffffffffff4,(longlong)paVar4,
                          (char *)in_stack_ffffffffffffffe0,0,(char *)0x17b27e,a);
      archive_format(paVar4);
      assertion_equal_int((char *)CONCAT44(iVar1,in_stack_fffffffffffffff8),
                          in_stack_fffffffffffffff4,(longlong)paVar4,
                          (char *)in_stack_ffffffffffffffe0,0,(char *)0x17b2ba,a);
      archive_entry_is_encrypted
                ((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
      assertion_equal_int((char *)CONCAT44(iVar1,in_stack_fffffffffffffff8),
                          in_stack_fffffffffffffff4,(longlong)paVar4,
                          (char *)in_stack_ffffffffffffffe0,0,(char *)0x17b2f3,a);
      archive_read_has_encrypted_entries(paVar4);
      assertion_equal_int((char *)CONCAT44(iVar1,in_stack_fffffffffffffff8),
                          in_stack_fffffffffffffff4,(longlong)paVar4,
                          (char *)in_stack_ffffffffffffffe0,(longlong)paVar4,(char *)0x17b32f,a);
      archive_read_close((archive *)0x17b339);
      assertion_equal_int((char *)CONCAT44(iVar1,in_stack_fffffffffffffff8),
                          in_stack_fffffffffffffff4,(longlong)paVar4,
                          (char *)in_stack_ffffffffffffffe0,(longlong)paVar4,(char *)0x17b368,a);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_lzma.c"
                     ,L'=');
      pcVar3 = archive_error_string(paVar2);
      test_skipping("Skipping LZMA compression check: %s",pcVar3);
      paVar4 = paVar2;
    }
    archive_read_free((archive *)0x17b372);
    assertion_equal_int((char *)CONCAT44(iVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                        (longlong)paVar4,(char *)in_stack_ffffffffffffffe0,0,(char *)0x17b3a0,a);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_format_gtar_lzma)
{
	int r;

	struct archive_entry *ae;
	struct archive *a;
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	r = archive_read_support_filter_lzma(a);
	if (r == ARCHIVE_WARN) {
		skipping("lzma reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}

	assertEqualIntA(a, ARCHIVE_OK, r);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	r = archive_read_open_memory2(a, archive, sizeof(archive), 3);
	if (r != ARCHIVE_OK) {
		skipping("Skipping LZMA compression check: %s",
		    archive_error_string(a));
		goto finish;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_LZMA);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_GNUTAR);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
finish:
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}